

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O3

int yy_declaration(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar3 = yymatchString(G,"%{");
  if (iVar3 != 0) {
    yyText(G,G->begin,G->end);
    iVar3 = G->pos;
    iVar5 = G->thunkpos;
    G->begin = iVar3;
    iVar4 = yymatchString(G,"%}");
    while (iVar4 == 0) {
      G->pos = iVar3;
      G->thunkpos = iVar5;
      if (G->limit <= iVar3) {
        iVar4 = yyrefill(G);
        if (iVar4 == 0) break;
        iVar3 = G->pos;
        iVar5 = G->thunkpos;
      }
      iVar3 = iVar3 + 1;
      G->pos = iVar3;
      iVar4 = yymatchString(G,"%}");
    }
    G->pos = iVar3;
    G->thunkpos = iVar5;
    yyText(G,G->begin,G->end);
    G->end = G->pos;
    iVar3 = yymatchString(G,"%}");
    if (iVar3 != 0) {
      yy__(G);
      yyDo(G,yy_1_declaration,G->begin,G->end,"yy_1_declaration");
      return 1;
    }
  }
  G->pos = iVar1;
  G->thunkpos = iVar2;
  return 0;
}

Assistant:

YY_RULE(int) yy_declaration(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "declaration"));
  if (!yymatchString(G, "%{")) goto l107;
  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l107;
  l108:;	
  {  int yypos109= G->pos, yythunkpos109= G->thunkpos;
  {  int yypos110= G->pos, yythunkpos110= G->thunkpos;  if (!yymatchString(G, "%}")) goto l110;
  goto l109;
  l110:;	  G->pos= yypos110; G->thunkpos= yythunkpos110;
  }  if (!yymatchDot(G)) goto l109;  goto l108;
  l109:;	  G->pos= yypos109; G->thunkpos= yythunkpos109;
  }  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l107;  if (!yy_RPERCENT(G))  goto l107;
  yyDo(G, yy_1_declaration, G->begin, G->end, "yy_1_declaration");
  yyprintf((stderr, "  ok   declaration"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l107:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "declaration"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}